

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-0.c
# Opt level: O0

int CheckFromArray(void)

{
  int iVar1;
  char *pcVar2;
  int local_24;
  uint local_20;
  int n;
  int passed;
  int i;
  FILE *out;
  
  _passed = fopen("out.txt","r");
  local_20 = 1;
  if (_passed == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    testN = testN + 1;
    out._4_4_ = -1;
  }
  else {
    for (n = 0; n < testInOut[testN].n; n = n + 1) {
      pcVar2 = ScanInt((FILE *)_passed,&local_24);
      if (pcVar2 != "PASSED") {
        local_20 = 0;
        break;
      }
      if (*(int *)((long)testN * 0x90 + 0x10632c + (long)n * 4) != local_24) {
        local_20 = 0;
        printf("wrong output -- ");
        break;
      }
    }
    if (local_20 != 0) {
      iVar1 = HaveGarbageAtTheEnd((FILE *)_passed);
      local_20 = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
    fclose(_passed);
    if (local_20 == 0) {
      printf("FAILED\n");
      testN = testN + 1;
      out._4_4_ = 1;
    }
    else {
      printf("PASSED\n");
      testN = testN + 1;
      out._4_4_ = 0;
    }
  }
  return out._4_4_;
}

Assistant:

static int CheckFromArray(void)
{
    FILE *const out = fopen("out.txt", "r");
    int i, passed = 1;
    if (!out) {
        printf("can't open out.txt\n");
        testN++;
        return -1;
    }
    for (i = 0; i < testInOut[testN].n; i++) {
        int n;
        if (ScanInt(out, &n) != Pass) {
            passed = 0;
            break;
        } else if (testInOut[testN].out[i] != n) {
            passed = 0;
            printf("wrong output -- ");
            break;
        }
    }
    if (passed) {
        passed = !HaveGarbageAtTheEnd(out);
    }
    fclose(out);
    if (passed) {
        printf("PASSED\n");
        testN++;
        return 0;
    } else {
        printf("FAILED\n");
        testN++;
        return 1;
    }
}